

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_functions.h
# Opt level: O0

void output_vec<std::vector<float,std::allocator<float>>>
               (vector<float,_std::allocator<float>_> *vec,ostream *stream)

{
  iterator this;
  bool bVar1;
  reference pfVar2;
  ostream *poVar3;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_28;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_20;
  iterator it;
  ostream *stream_local;
  vector<float,_std::allocator<float>_> *vec_local;
  
  it._M_current = (float *)stream;
  local_20._M_current = (float *)std::vector<float,_std::allocator<float>_>::begin(vec);
  while( true ) {
    local_28._M_current = (float *)std::vector<float,_std::allocator<float>_>::end(vec);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    this = it;
    if (!bVar1) break;
    pfVar2 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&local_20);
    poVar3 = (ostream *)std::ostream::operator<<(this._M_current,*pfVar2);
    std::operator<<(poVar3," ");
    __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::operator++
              (&local_20);
  }
  std::operator<<((ostream *)it._M_current,"\n");
  return;
}

Assistant:

void output_vec(T vec, std::ostream & stream=std::clog) 
{
  for (auto it = vec.begin(); it != vec.end(); ++it)
  {
    stream << *it << " ";
  }
  stream << "\n";
  return;
}